

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O3

int main(void)

{
  size_type *psVar1;
  ostream *poVar2;
  undefined8 uVar3;
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  undefined4 local_2a0 [2];
  P p1;
  P p3;
  P p4;
  P p5;
  P searchRectMax;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> tree;
  P p2;
  P searchRectMin;
  vector<P_*,_std::allocator<P_*>_> result;
  vector<P_*,_std::allocator<P_*>_> values;
  
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"a","");
  local_2a0[0] = 0;
  p1.d0 = 0;
  p1._4_4_ = 0x40000000;
  p1.d1 = (double)&p1.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p1.d1,local_2c0,local_2c0 + local_2b8);
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"b","");
  tree.boundingBoxMax._0_4_ = 1;
  p2.d0 = 0;
  p2._4_4_ = 0x40000000;
  p2.d1 = (double)&p2.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p2.d1,local_198,local_198 + local_190);
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  local_178 = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"c","");
  p1.d2.field_2._8_4_ = 1;
  p3.d0 = 0;
  p3._4_4_ = 0x40000000;
  p3.d1 = (double)&p3.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p3.d1,local_178,local_178 + local_170);
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"d","");
  p3.d2.field_2._8_4_ = 1;
  p4.d0 = 0;
  p4._4_4_ = 0x401c0000;
  p4.d1 = (double)&p4.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p4.d1,local_158,local_158 + local_150);
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"e","");
  p4.d2.field_2._8_4_ = 1;
  p5.d0 = 0;
  p5._4_4_ = 0x40000000;
  p5.d1 = (double)&p5.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&p5.d1,local_138,local_138 + local_130);
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p2.d2.field_2._8_8_ = local_2a0;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(iterator)0x0,(P **)((long)&p2.d2.field_2 + 8));
  p2.d2.field_2._8_8_ = &tree.boundingBoxMax;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(iterator)0x0,(P **)((long)&p2.d2.field_2 + 8));
  p2.d2.field_2._8_8_ = (long)&p1.d2.field_2 + 8;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(iterator)0x0,(P **)((long)&p2.d2.field_2 + 8));
  p2.d2.field_2._8_8_ = (long)&p3.d2.field_2 + 8;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(iterator)0x0,(P **)((long)&p2.d2.field_2 + 8));
  p2.d2.field_2._8_8_ = (long)&p4.d2.field_2 + 8;
  std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(iterator)0x0,(P **)((long)&p2.d2.field_2 + 8));
  std::vector<P_*,_std::allocator<P_*>_>::vector
            ((vector<P_*,_std::allocator<P_*>_> *)((long)&searchRectMax.d2.field_2 + 8),
             (vector<P_*,_std::allocator<P_*>_> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::KDTree
            ((KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_d8,
             (vector<P_*,_std::allocator<P_*>_> *)((long)&searchRectMax.d2.field_2 + 8));
  if (searchRectMax.d2.field_2._8_8_ != 0) {
    operator_delete((void *)searchRectMax.d2.field_2._8_8_);
  }
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"b","");
  p2.d2.field_2._8_8_ = p2.d2.field_2._8_8_ & 0xffffffff00000000;
  searchRectMin.d0 = 0;
  searchRectMin._4_4_ = 0;
  psVar1 = &searchRectMin.d2._M_string_length;
  searchRectMin.d1 = (double)psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&searchRectMin.d1,local_118,local_118 + local_110);
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"d","");
  p5.d2.field_2._8_4_ = 2;
  searchRectMax.d0 = 0;
  searchRectMax._4_4_ = 0x40180000;
  searchRectMax.d1 = (double)&searchRectMax.d2._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&searchRectMax.d1,local_f8,local_f8 + local_f0);
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
            ((vector<P_*,_std::allocator<P_*>_> *)((long)&searchRectMin.d2.field_2 + 8),
             (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_d8,
             (P *)((long)&p2.d2.field_2 + 8),(P *)((long)&p5.d2.field_2 + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found ",6);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," entries:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  uVar3 = searchRectMin.d2.field_2._8_8_;
  if ((pointer)searchRectMin.d2.field_2._8_8_ !=
      result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data._M_start)
  {
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(*(P **)uVar3)->d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<double>((*(P **)uVar3)->d1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,((*(P **)uVar3)->d2)._M_dataplus._M_p,
                          ((*(P **)uVar3)->d2)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar3 = uVar3 + 8;
    } while ((pointer)uVar3 !=
             result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
             _M_start);
  }
  if ((void *)searchRectMin.d2.field_2._8_8_ != (void *)0x0) {
    operator_delete((void *)searchRectMin.d2.field_2._8_8_);
  }
  if ((size_type *)searchRectMax.d1 != &searchRectMax.d2._M_string_length) {
    operator_delete((void *)searchRectMax.d1);
  }
  if ((size_type *)searchRectMin.d1 != psVar1) {
    operator_delete((void *)searchRectMin.d1);
  }
  P_delete::operator()((P_delete *)(p2.d2.field_2._M_local_buf + 8),(P *)tree.root);
  P_delete::operator()((P_delete *)(p2.d2.field_2._M_local_buf + 8),tree.boundingBoxMin);
  if (result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if ((size_type *)p5.d1 != &p5.d2._M_string_length) {
    operator_delete((void *)p5.d1);
  }
  if ((size_type *)p4.d1 != &p4.d2._M_string_length) {
    operator_delete((void *)p4.d1);
  }
  if ((size_type *)p3.d1 != &p3.d2._M_string_length) {
    operator_delete((void *)p3.d1);
  }
  if ((size_type *)p2.d1 != &p2.d2._M_string_length) {
    operator_delete((void *)p2.d1);
  }
  if ((size_type *)p1.d1 != &p1.d2._M_string_length) {
    operator_delete((void *)p1.d1);
  }
  return 1;
}

Assistant:

int main() {
	// prepare elements, three dimensional P objects
	P p1(0, 2, "a");
	P p2(1, 2, "b");
	P p3(1, 2, "c");
	P p4(1, 7, "d");
	P p5(1, 2, "e");

	// prepare the entries
	std::vector<P*> values;
	values.push_back(&p1);
	values.push_back(&p2);
	values.push_back(&p3);
	values.push_back(&p4);
	values.push_back(&p5);

	// the tree uses default implementations of new, delete, set and less for arrays.
	// since we don't use arrays, but the custom type P, we need to pass the functors we defined above to enable the tree to work with P
	kdtree::KDTree<P, dim, P_new, P_delete, P_set, P_less> tree(values);

	// prepare search query.
	// we search for P objects that match these criterias:
	//	d0 >= 0, d0 <= 2
	//	d1 >= 0, d1 <= 6
	//	d2 >= "b", d2 <= "d"
	P searchRectMin(0, 0, "b");
	P searchRectMax(2, 6, "d");

	// perform the search. result will contain the elements that match the query.
	std::vector<P*> result = tree.queryRectangle(&searchRectMin, &searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for (std::vector<P*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)->d0 << " " << (*it)->d1 << " " << (*it)->d2 << std::endl;
	}

	return 1;
}